

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineLargeContiguousImpl64
                   (uint64_t state,uchar *first,size_t len)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  
  if (0x3ff < len) {
    do {
      uVar2 = LowLevelHashLenGt16(first,0x400,0x457a38,kStaticRandomData);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2 ^ state;
      state = SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8) ^
              SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0);
      len = len - 0x400;
      first = first + 0x400;
    } while (0x3ff < len);
  }
  uVar2 = CombineContiguousImpl(state,first,len);
  return uVar2;
}

Assistant:

uint64_t MixingHashState::CombineLargeContiguousImpl64(
    uint64_t state, const unsigned char* first, size_t len) {
  while (len >= PiecewiseChunkSize()) {
    state = Mix(state ^ Hash64(first, PiecewiseChunkSize()), kMul);
    len -= PiecewiseChunkSize();
    first += PiecewiseChunkSize();
  }
  // Handle the remainder.
  return CombineContiguousImpl(state, first, len,
                               std::integral_constant<int, 8>{});
}